

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O3

void __thiscall TempData::start(TempData *this)

{
  path *this_00;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar4;
  unsigned_long uVar5;
  pointer pcVar6;
  size_t equCount;
  size_t labelCount;
  size_t lineCount;
  size_t fileCount;
  char *local_70;
  size_t local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  string local_50;
  
  this_00 = &(this->file).fileName;
  bVar2 = ghc::filesystem::path::empty(this_00);
  if (!bVar2) {
    iVar3 = TextFile::open(&this->file,(char *)0x1,5);
    if ((char)iVar3 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_50,this_00);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x1897d3,(char *)&local_50,in_RCX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)FileList::size(&Global.fileList);
      sVar1 = Global.symbolTable.equationsCount;
      uVar5 = (unsigned_long)Global.FileInfo.TotalLineCount;
      lVar4 = (long)Global.symbolTable.labels.
                    super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Global.symbolTable.labels.
                    super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_60 = lVar4 >> 4;
      local_68 = Global.symbolTable.equationsCount;
      local_70 = "files";
      if (local_50._M_dataplus._M_p == (pointer)0x1) {
        local_70 = "file";
      }
      local_58 = uVar5;
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S included\n",(unsigned_long *)&local_50,&local_70);
      local_70 = "lines";
      if (uVar5 == 1) {
        local_70 = "line";
      }
      TextFile::writeFormat<unsigned_long,char_const*>(&this->file,"; %d %S\n",&local_58,&local_70);
      local_70 = "labels";
      if (lVar4 == 0x10) {
        local_70 = "label";
      }
      TextFile::writeFormat<unsigned_long,char_const*>(&this->file,"; %d %S\n",&local_60,&local_70);
      local_70 = "equations";
      if (sVar1 == 1) {
        local_70 = "equation";
      }
      TextFile::writeFormat<unsigned_long,char_const*>
                (&this->file,"; %d %S\n\n",&local_68,&local_70);
      if (local_50._M_dataplus._M_p != (pointer)0x0) {
        pcVar6 = (pointer)0x0;
        do {
          args = FileList::string_abi_cxx11_(&Global.fileList,(int)pcVar6);
          TextFile::writeFormat<std::__cxx11::string>(&this->file,"; %S\n",args);
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 < local_50._M_dataplus._M_p);
      }
      TextFile::writeLine(&this->file,"");
    }
  }
  return;
}

Assistant:

void TempData::start()
{
	if (!file.getFileName().empty())
	{
		if (!file.open(TextFile::Write))
		{
			Logger::printError(Logger::Error,"Could not open temp file %s.",file.getFileName().u8string());
			return;
		}

		size_t fileCount = Global.fileList.size();
		size_t lineCount = Global.FileInfo.TotalLineCount;
		size_t labelCount = Global.symbolTable.getLabelCount();
		size_t equCount = Global.symbolTable.getEquationCount();

		file.writeFormat("; %d %S included\n",fileCount,fileCount == 1 ? "file" : "files");
		file.writeFormat("; %d %S\n",lineCount,lineCount == 1 ? "line" : "lines");
		file.writeFormat("; %d %S\n",labelCount,labelCount == 1 ? "label" : "labels");
		file.writeFormat("; %d %S\n\n",equCount,equCount == 1 ? "equation" : "equations");
		for (size_t i = 0; i < fileCount; i++)
		{
			file.writeFormat("; %S\n",Global.fileList.string(int(i)));
		}
		file.writeLine("");
	}
}